

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O2

void __thiscall
swrenderer::DrawColumnRt4ShadedPalCommand::Execute
          (DrawColumnRt4ShadedPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  byte *pbVar11;
  uint uVar12;
  long lVar13;
  
  iVar8 = (this->super_PalRtCommand).yl;
  iVar8 = DrawerThread::count_for_thread(thread,iVar8,((this->super_PalRtCommand).yh - iVar8) + 1);
  if (0 < iVar8) {
    iVar1 = (this->super_PalRtCommand)._color;
    puVar5 = (this->super_PalRtCommand)._colormap;
    iVar2 = (this->super_PalRtCommand).yl;
    iVar9 = DrawerThread::skipped_by_thread(thread,iVar2);
    iVar3 = (this->super_PalRtCommand).sx;
    iVar2 = (&ylookup)[iVar9 + iVar2];
    puVar6 = (this->super_PalRtCommand)._destorg;
    puVar7 = thread->dc_temp;
    iVar10 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    iVar10 = iVar10 << 2;
    iVar9 = thread->num_cores;
    iVar4 = (this->super_PalRtCommand)._pitch;
    pbVar11 = puVar6 + (long)(iVar3 + iVar2) + 3;
    lVar13 = 0;
    do {
      uVar12 = Col2RGB8[puVar5[puVar7[lVar13 * 4 + (long)iVar10]]][iVar1] +
               Col2RGB8[0x40 - puVar5[puVar7[lVar13 * 4 + (long)iVar10]]][pbVar11[-3]] | 0x1f07c1f;
      pbVar11[-3] = RGB32k.All[uVar12 >> 0xf & uVar12];
      uVar12 = Col2RGB8[puVar5[puVar7[lVar13 * 4 + (long)iVar10 + 1]]][iVar1] +
               Col2RGB8[0x40 - puVar5[puVar7[lVar13 * 4 + (long)iVar10 + 1]]][pbVar11[-2]] |
               0x1f07c1f;
      pbVar11[-2] = RGB32k.All[uVar12 >> 0xf & uVar12];
      uVar12 = Col2RGB8[puVar5[puVar7[lVar13 * 4 + (long)iVar10 + 2]]][iVar1] +
               Col2RGB8[0x40 - puVar5[puVar7[lVar13 * 4 + (long)iVar10 + 2]]][pbVar11[-1]] |
               0x1f07c1f;
      pbVar11[-1] = RGB32k.All[uVar12 >> 0xf & uVar12];
      uVar12 = Col2RGB8[puVar5[puVar7[lVar13 * 4 + (long)iVar10 + 3]]][iVar1] +
               Col2RGB8[0x40 - puVar5[puVar7[lVar13 * 4 + (long)iVar10 + 3]]][*pbVar11] | 0x1f07c1f;
      *pbVar11 = RGB32k.All[uVar12 >> 0xf & uVar12];
      pbVar11 = pbVar11 + iVar9 * iVar4;
      lVar13 = lVar13 + 1;
    } while (iVar8 != (int)lVar13);
  }
  return;
}

Assistant:

void DrawColumnRt4ShadedPalCommand::Execute(DrawerThread *thread)
	{
		uint32_t *fgstart;
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		fgstart = &Col2RGB8[0][_color];
		colormap = _colormap;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		pitch = _pitch * thread->num_cores;

		do {
			uint32_t val;
		
			val = colormap[source[0]];
			val = (Col2RGB8[64-val][dest[0]] + fgstart[val<<8]) | 0x1f07c1f;
			dest[0] = RGB32k.All[val & (val>>15)];

			val = colormap[source[1]];
			val = (Col2RGB8[64-val][dest[1]] + fgstart[val<<8]) | 0x1f07c1f;
			dest[1] = RGB32k.All[val & (val>>15)];

			val = colormap[source[2]];
			val = (Col2RGB8[64-val][dest[2]] + fgstart[val<<8]) | 0x1f07c1f;
			dest[2] = RGB32k.All[val & (val>>15)];

			val = colormap[source[3]];
			val = (Col2RGB8[64-val][dest[3]] + fgstart[val<<8]) | 0x1f07c1f;
			dest[3] = RGB32k.All[val & (val>>15)];

			source += 4;
			dest += pitch;
		} while (--count);
	}